

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O0

void nghttp2_map_print_distance(nghttp2_map *map)

{
  uint uVar1;
  uint uVar2;
  FILE *__stream;
  nghttp2_map_bucket *bkt_00;
  size_t idx_00;
  size_t sVar3;
  nghttp2_map_bucket *bkt;
  size_t idx;
  uint32_t i;
  nghttp2_map *map_local;
  
  for (idx._4_4_ = 0; idx._4_4_ < map->tablelen; idx._4_4_ = idx._4_4_ + 1) {
    bkt_00 = map->table + idx._4_4_;
    if (bkt_00->data == (void *)0x0) {
      fprintf(_stderr,"@%u <EMPTY>\n",(ulong)idx._4_4_);
    }
    else {
      idx_00 = h2idx(bkt_00->hash,map->tablelenbits);
      __stream = _stderr;
      uVar1 = bkt_00->hash;
      uVar2 = bkt_00->key;
      sVar3 = distance(map->tablelen,map->tablelenbits,bkt_00,idx_00);
      fprintf(__stream,"@%u hash=%08x key=%d base=%zu distance=%zu\n",(ulong)idx._4_4_,(ulong)uVar1,
              (ulong)uVar2,idx_00,sVar3);
    }
  }
  return;
}

Assistant:

void nghttp2_map_print_distance(nghttp2_map *map) {
  uint32_t i;
  size_t idx;
  nghttp2_map_bucket *bkt;

  for (i = 0; i < map->tablelen; ++i) {
    bkt = &map->table[i];

    if (bkt->data == NULL) {
      fprintf(stderr, "@%u <EMPTY>\n", i);
      continue;
    }

    idx = h2idx(bkt->hash, map->tablelenbits);
    fprintf(stderr, "@%u hash=%08x key=%d base=%zu distance=%zu\n", i,
            bkt->hash, bkt->key, idx,
            distance(map->tablelen, map->tablelenbits, bkt, idx));
  }
}